

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 8_arr_func_range.cpp
# Opt level: O2

int arr_func_range(void)

{
  int cookies [8];
  
  std::operator<<((ostream *)&std::cout,"Yeah, let\'s start!");
}

Assistant:

int arr_func_range() {
    using namespace std;
    int cookies[ArSize] = {1, 2, 4,  8, 16, 32, 64, 128};

    cout << "Yeah, let's start!" << endl;
    // cookies are actually *address*
    int sum = sum_arr_by_range(cookies, cookies + ArSize);
    cout << "Total cookies eaten: " << sum << endl;
    sum = sum_arr_by_range(cookies, cookies + 3);
    cout << "First three eaters ate " << sum << " cookies " << endl;
    sum = sum_arr_by_range(cookies + 4, cookies + 8);
    cout << "Last four eaters ate " << sum << " cookies " << endl;
    return 0;
}